

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_convolve_avx2.c
# Opt level: O2

void av1_wiener_convolve_add_src_avx2
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  uint uVar1;
  undefined1 auVar2 [32];
  char cVar3;
  char cVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  long lVar15;
  uint8_t *puVar16;
  long lVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  undefined1 (*pauVar20) [32];
  ulong uVar21;
  long lVar22;
  int iVar23;
  undefined2 uVar24;
  undefined4 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  ushort uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  int16_t im_block [1088];
  uint8_t *local_a08;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined1 auStack_880 [16];
  undefined8 auStack_870 [264];
  
  lVar15 = (long)(h * 8 + 0x30);
  lVar17 = lVar15 * 2;
  *(undefined8 *)(auStack_880 + lVar17) = 0;
  *(undefined8 *)(auStack_880 + lVar17 + 8) = 0;
  *(undefined8 *)((long)auStack_870 + lVar17) = 0;
  *(undefined8 *)((long)auStack_870 + lVar17 + 8) = 0;
  lVar17 = lVar15 * 2;
  *(undefined8 *)(local_8a0 + lVar17) = 0;
  *(undefined8 *)(local_8a0 + lVar17 + 8) = 0;
  *(undefined8 *)(auStack_890 + lVar17) = 0;
  *(undefined8 *)(auStack_890 + lVar17 + 8) = 0;
  lVar17 = lVar15 * 2;
  *(undefined8 *)(local_8c0 + lVar17) = 0;
  *(undefined8 *)(local_8c0 + lVar17 + 8) = 0;
  *(undefined8 *)(auStack_8b0 + lVar17) = 0;
  *(undefined8 *)(auStack_8b0 + lVar17 + 8) = 0;
  lVar15 = lVar15 * 2;
  *(undefined8 *)(local_8e0 + lVar15) = 0;
  *(undefined8 *)(local_8e0 + lVar15 + 8) = 0;
  *(undefined8 *)(auStack_8d0 + lVar15) = 0;
  *(undefined8 *)(auStack_8d0 + lVar15 + 8) = 0;
  auVar43 = *(undefined1 (*) [16])filter_x;
  auVar6 = vpshufb_avx(auVar43,_DAT_004bcf80);
  puVar18 = src + src_stride * -3 + -3;
  uVar24 = auVar6._0_2_;
  auVar33._2_2_ = uVar24;
  auVar33._0_2_ = uVar24;
  auVar33._4_2_ = uVar24;
  auVar33._6_2_ = uVar24;
  auVar33._8_2_ = uVar24;
  auVar33._10_2_ = uVar24;
  auVar33._12_2_ = uVar24;
  auVar33._14_2_ = uVar24;
  auVar33._16_2_ = uVar24;
  auVar33._18_2_ = uVar24;
  auVar33._20_2_ = uVar24;
  auVar33._22_2_ = uVar24;
  auVar33._24_2_ = uVar24;
  auVar33._26_2_ = uVar24;
  auVar33._28_2_ = uVar24;
  auVar33._30_2_ = uVar24;
  auVar6 = vpshufb_avx(auVar43,_DAT_004bcee0);
  uVar24 = auVar6._0_2_;
  auVar34._2_2_ = uVar24;
  auVar34._0_2_ = uVar24;
  auVar34._4_2_ = uVar24;
  auVar34._6_2_ = uVar24;
  auVar34._8_2_ = uVar24;
  auVar34._10_2_ = uVar24;
  auVar34._12_2_ = uVar24;
  auVar34._14_2_ = uVar24;
  auVar34._16_2_ = uVar24;
  auVar34._18_2_ = uVar24;
  auVar34._20_2_ = uVar24;
  auVar34._22_2_ = uVar24;
  auVar34._24_2_ = uVar24;
  auVar34._26_2_ = uVar24;
  auVar34._28_2_ = uVar24;
  auVar34._30_2_ = uVar24;
  auVar6 = vpshufb_avx(auVar43,_DAT_004bcef0);
  uVar24 = auVar6._0_2_;
  auVar35._2_2_ = uVar24;
  auVar35._0_2_ = uVar24;
  auVar35._4_2_ = uVar24;
  auVar35._6_2_ = uVar24;
  auVar35._8_2_ = uVar24;
  auVar35._10_2_ = uVar24;
  auVar35._12_2_ = uVar24;
  auVar35._14_2_ = uVar24;
  auVar35._16_2_ = uVar24;
  auVar35._18_2_ = uVar24;
  auVar35._20_2_ = uVar24;
  auVar35._22_2_ = uVar24;
  auVar35._24_2_ = uVar24;
  auVar35._26_2_ = uVar24;
  auVar35._28_2_ = uVar24;
  auVar35._30_2_ = uVar24;
  auVar43 = vpshufb_avx(auVar43,_DAT_004bcf90);
  uVar24 = auVar43._0_2_;
  auVar36._2_2_ = uVar24;
  auVar36._0_2_ = uVar24;
  auVar36._4_2_ = uVar24;
  auVar36._6_2_ = uVar24;
  auVar36._8_2_ = uVar24;
  auVar36._10_2_ = uVar24;
  auVar36._12_2_ = uVar24;
  auVar36._14_2_ = uVar24;
  auVar36._16_2_ = uVar24;
  auVar36._18_2_ = uVar24;
  auVar36._20_2_ = uVar24;
  auVar36._22_2_ = uVar24;
  auVar36._24_2_ = uVar24;
  auVar36._26_2_ = uVar24;
  auVar36._28_2_ = uVar24;
  auVar36._30_2_ = uVar24;
  cVar3 = (char)conv_params->round_0;
  uVar30 = ~(ushort)(-1 << (0x10U - cVar3 & 0x1f));
  cVar4 = (char)conv_params->round_1;
  uVar24 = (undefined2)(1 << (cVar3 - 1U & 0x1f));
  auVar37._2_2_ = uVar24;
  auVar37._0_2_ = uVar24;
  auVar37._4_2_ = uVar24;
  auVar37._6_2_ = uVar24;
  auVar37._8_2_ = uVar24;
  auVar37._10_2_ = uVar24;
  auVar37._12_2_ = uVar24;
  auVar37._14_2_ = uVar24;
  auVar37._16_2_ = uVar24;
  auVar37._18_2_ = uVar24;
  auVar37._20_2_ = uVar24;
  auVar37._22_2_ = uVar24;
  auVar37._24_2_ = uVar24;
  auVar37._26_2_ = uVar24;
  auVar37._28_2_ = uVar24;
  auVar37._30_2_ = uVar24;
  uVar24 = (undefined2)(1 << (0xeU - cVar3 & 0x1f));
  auVar38._2_2_ = uVar24;
  auVar38._0_2_ = uVar24;
  auVar38._4_2_ = uVar24;
  auVar38._6_2_ = uVar24;
  auVar38._8_2_ = uVar24;
  auVar38._10_2_ = uVar24;
  auVar38._12_2_ = uVar24;
  auVar38._14_2_ = uVar24;
  auVar38._16_2_ = uVar24;
  auVar38._18_2_ = uVar24;
  auVar38._20_2_ = uVar24;
  auVar38._22_2_ = uVar24;
  auVar38._24_2_ = uVar24;
  auVar38._26_2_ = uVar24;
  auVar38._28_2_ = uVar24;
  auVar38._30_2_ = uVar24;
  auVar44._2_2_ = uVar30;
  auVar44._0_2_ = uVar30;
  auVar44._4_2_ = uVar30;
  auVar44._6_2_ = uVar30;
  auVar44._8_2_ = uVar30;
  auVar44._10_2_ = uVar30;
  auVar44._12_2_ = uVar30;
  auVar44._14_2_ = uVar30;
  auVar44._16_2_ = uVar30;
  auVar44._18_2_ = uVar30;
  auVar44._20_2_ = uVar30;
  auVar44._22_2_ = uVar30;
  auVar44._24_2_ = uVar30;
  auVar44._26_2_ = uVar30;
  auVar44._28_2_ = uVar30;
  auVar44._30_2_ = uVar30;
  uVar1 = conv_params->round_0;
  auVar43 = vpaddw_avx(*(undefined1 (*) [16])filter_y,_DAT_004ba5d0);
  uVar25 = auVar43._0_4_;
  auVar6 = vpshufd_avx(auVar43,0x55);
  uVar26 = auVar6._0_8_;
  auVar39._8_8_ = uVar26;
  auVar39._0_8_ = uVar26;
  auVar39._16_8_ = uVar26;
  auVar39._24_8_ = uVar26;
  auVar6 = vpshufd_avx(auVar43,0xfa);
  uVar26 = auVar6._0_8_;
  auVar40._8_8_ = uVar26;
  auVar40._0_8_ = uVar26;
  auVar40._16_8_ = uVar26;
  auVar40._24_8_ = uVar26;
  auVar43 = vpshufd_avx(auVar43,0xff);
  uVar26 = auVar43._0_8_;
  auVar41._8_8_ = uVar26;
  auVar41._0_8_ = uVar26;
  auVar41._16_8_ = uVar26;
  auVar41._24_8_ = uVar26;
  iVar23 = (-1 << (cVar4 + 7U & 0x1f)) + (1 << (cVar4 - 1U & 0x1f));
  auVar42._4_4_ = iVar23;
  auVar42._0_4_ = iVar23;
  auVar42._8_4_ = iVar23;
  auVar42._12_4_ = iVar23;
  auVar42._16_4_ = iVar23;
  auVar42._20_4_ = iVar23;
  auVar42._24_4_ = iVar23;
  auVar42._28_4_ = iVar23;
  uVar5 = conv_params->round_1;
  puVar19 = src + src_stride * -2 + -3;
  local_a08 = dst;
  for (lVar17 = 0; lVar17 < w; lVar17 = lVar17 + 8) {
    lVar15 = 0;
    pauVar20 = (undefined1 (*) [32])local_8e0;
    for (lVar22 = 0; lVar22 < h + 6; lVar22 = lVar22 + 2) {
      auVar43 = *(undefined1 (*) [16])(puVar18 + lVar15);
      auVar27._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar43;
      auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      if (lVar22 < h + 5) {
        auVar27._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(puVar19 + lVar15) + ZEXT116(1) * auVar27._0_16_;
        auVar27._16_16_ =
             ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * *(undefined1 (*) [16])(puVar19 + lVar15);
      }
      auVar10 = vpshufb_avx2(auVar27,_DAT_004694e0);
      auVar10 = vpmaddubsw_avx2(auVar10,auVar34);
      auVar11 = vpshufb_avx2(auVar27,_DAT_00469500);
      auVar11 = vpmaddubsw_avx2(auVar11,auVar35);
      auVar10 = vpaddw_avx2(auVar10,auVar11);
      auVar11 = vpshufb_avx2(auVar27,_DAT_00469560);
      auVar11 = vpmaddubsw_avx2(auVar11,auVar33);
      auVar11 = vpaddw_avx2(auVar37,auVar11);
      auVar10 = vpaddw_avx2(auVar11,auVar10);
      auVar11 = vpshufb_avx2(auVar27,_DAT_00469580);
      auVar11 = vpmaddubsw_avx2(auVar11,auVar36);
      auVar10 = vpaddw_avx2(auVar10,auVar11);
      auVar27 = vpshufb_avx2(auVar27,_DAT_004bd7a0);
      auVar27 = vpsllw_avx2(auVar27,ZEXT416(7 - conv_params->round_0));
      auVar10 = vpsraw_avx2(auVar10,ZEXT416(uVar1));
      auVar27 = vpaddw_avx2(auVar38,auVar27);
      auVar27 = vpaddw_avx2(auVar10,auVar27);
      auVar27 = vpmaxsw_avx2(auVar27,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar27 = vpminsw_avx2(auVar44,auVar27);
      *pauVar20 = auVar27;
      pauVar20 = pauVar20 + 1;
      lVar15 = lVar15 + src_stride * 2;
    }
    auVar10._16_16_ = auStack_8d0;
    auVar10._0_16_ = local_8e0;
    auVar11._16_16_ = local_8c0;
    auVar11._0_16_ = auStack_8d0;
    auVar2._16_16_ = auStack_8b0;
    auVar2._0_16_ = local_8c0;
    auVar8._16_16_ = local_8a0;
    auVar8._0_16_ = auStack_8b0;
    auVar9._16_16_ = auStack_890;
    auVar9._0_16_ = local_8a0;
    auVar12._16_16_ = auStack_880;
    auVar12._0_16_ = auStack_890;
    auVar13 = vpunpcklwd_avx2(auVar10,auVar11);
    auVar28 = vpunpcklwd_avx2(auVar2,auVar8);
    auVar29 = vpunpcklwd_avx2(auVar9,auVar12);
    auVar27 = vpunpckhwd_avx2(auVar10,auVar11);
    auVar10 = vpunpckhwd_avx2(auVar2,auVar8);
    auVar11 = vpunpckhwd_avx2(auVar9,auVar12);
    uVar21 = 0;
    puVar16 = local_a08;
    for (lVar15 = 0; auVar43 = ZEXT416(uVar5), lVar15 < h + -1; lVar15 = lVar15 + 2) {
      auVar2 = *(undefined1 (*) [32])((long)auStack_870 + uVar21 * 2);
      auVar31 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_880 + uVar21 * 2),auVar2);
      auVar12 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_880 + uVar21 * 2),auVar2);
      auVar2 = vpmaddwd_avx2(auVar28,auVar39);
      auVar8 = vpmaddwd_avx2(auVar40,auVar29);
      auVar2 = vpaddd_avx2(auVar2,auVar8);
      auVar8 = vpmaddwd_avx2(auVar39,auVar10);
      auVar9 = vpmaddwd_avx2(auVar40,auVar11);
      auVar8 = vpaddd_avx2(auVar9,auVar8);
      auVar14._4_4_ = uVar25;
      auVar14._0_4_ = uVar25;
      auVar14._8_4_ = uVar25;
      auVar14._12_4_ = uVar25;
      auVar14._16_4_ = uVar25;
      auVar14._20_4_ = uVar25;
      auVar14._24_4_ = uVar25;
      auVar14._28_4_ = uVar25;
      auVar13 = vpmaddwd_avx2(auVar14,auVar13);
      auVar13 = vpaddd_avx2(auVar42,auVar13);
      auVar13 = vpaddd_avx2(auVar2,auVar13);
      auVar2 = vpmaddwd_avx2(auVar41,auVar31);
      auVar13 = vpaddd_avx2(auVar2,auVar13);
      auVar27 = vpmaddwd_avx2(auVar14,auVar27);
      auVar27 = vpaddd_avx2(auVar42,auVar27);
      auVar27 = vpaddd_avx2(auVar27,auVar8);
      auVar2 = vpmaddwd_avx2(auVar41,auVar12);
      auVar13 = vpsrad_avx2(auVar13,auVar43);
      auVar27 = vpaddd_avx2(auVar27,auVar2);
      auVar27 = vpsrad_avx2(auVar27,auVar43);
      auVar27 = vpackssdw_avx2(auVar13,auVar27);
      auVar27 = vpackuswb_avx2(auVar27,auVar29);
      *(long *)puVar16 = auVar27._0_8_;
      *(long *)(puVar16 + dst_stride) = auVar27._16_8_;
      puVar16 = puVar16 + dst_stride * 2;
      uVar21 = uVar21 + 0x10;
      auVar27 = auVar10;
      auVar13 = auVar28;
      auVar10 = auVar11;
      auVar28 = auVar29;
      auVar29 = auVar31;
      auVar11 = auVar12;
    }
    if (h != (int)lVar15) {
      auVar31._0_16_ = ZEXT116(0) * auVar27._0_16_ + ZEXT116(1) * auVar13._0_16_;
      auVar31._16_16_ = ZEXT116(0) * auVar13._16_16_ + ZEXT116(1) * auVar27._0_16_;
      auVar32._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar28._0_16_;
      auVar32._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar10._0_16_;
      auVar28._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar29._0_16_;
      auVar28._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar11._0_16_;
      auVar6 = *(undefined1 (*) [16])((long)auStack_870 + (uVar21 & 0xffffffff) * 2);
      auVar7 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_880 + (uVar21 & 0xffffffff) * 2),auVar6
                             );
      auVar6 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_880 + (uVar21 & 0xffffffff) * 2),auVar6
                             );
      auVar29._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
      auVar29._16_16_ = ZEXT116(1) * auVar6;
      auVar13._4_4_ = uVar25;
      auVar13._0_4_ = uVar25;
      auVar13._8_4_ = uVar25;
      auVar13._12_4_ = uVar25;
      auVar13._16_4_ = uVar25;
      auVar13._20_4_ = uVar25;
      auVar13._24_4_ = uVar25;
      auVar13._28_4_ = uVar25;
      auVar10 = vpmaddwd_avx2(auVar31,auVar13);
      auVar27 = vpmaddwd_avx2(auVar39,auVar32);
      auVar11 = vpmaddwd_avx2(auVar40,auVar28);
      auVar27 = vpaddd_avx2(auVar27,auVar11);
      auVar11 = vpmaddwd_avx2(auVar41,auVar29);
      auVar10 = vpaddd_avx2(auVar42,auVar10);
      auVar27 = vpaddd_avx2(auVar10,auVar27);
      auVar27 = vpaddd_avx2(auVar27,auVar11);
      auVar27 = vpsrad_avx2(auVar27,auVar43);
      auVar43 = vpackusdw_avx(auVar27._0_16_,auVar27._16_16_);
      auVar43 = vpackuswb_avx(auVar43,auVar43);
      *(long *)puVar16 = auVar43._0_8_;
    }
    puVar19 = puVar19 + 8;
    puVar18 = puVar18 + 8;
    local_a08 = local_a08 + 8;
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_avx2(const uint8_t *src, ptrdiff_t src_stride,
                                      uint8_t *dst, ptrdiff_t dst_stride,
                                      const int16_t *filter_x, int x_step_q4,
                                      const int16_t *filter_y, int y_step_q4,
                                      int w, int h,
                                      const WienerConvolveParams *conv_params) {
  const int bd = 8;
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  (void)x_step_q4;
  (void)y_step_q4;

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + SUBPEL_TAPS) * 8]);
  int im_h = h + SUBPEL_TAPS - 2;
  int im_stride = 8;
  memset(im_block + (im_h * im_stride), 0, MAX_SB_SIZE);
  int i, j;
  const int center_tap = (SUBPEL_TAPS - 1) / 2;
  const uint8_t *const src_ptr = src - center_tap * src_stride - center_tap;

  __m256i filt[4], coeffs_h[4], coeffs_v[4], filt_center;

  assert(conv_params->round_0 > 0);

  filt[0] = _mm256_load_si256((__m256i const *)filt1_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)filt2_global_avx2);
  filt[2] = _mm256_load_si256((__m256i const *)filt3_global_avx2);
  filt[3] = _mm256_load_si256((__m256i const *)filt4_global_avx2);

  filt_center = _mm256_load_si256((__m256i const *)filt_center_global_avx2);

  const __m128i coeffs_x = _mm_loadu_si128((__m128i *)filter_x);
  const __m256i filter_coeffs_x = _mm256_broadcastsi128_si256(coeffs_x);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs_h[0] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0200u));
  // coeffs 2 3 2 3 2 3 2 3
  coeffs_h[1] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0604u));
  // coeffs 4 5 4 5 4 5 4 5
  coeffs_h[2] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0a08u));
  // coeffs 6 7 6 7 6 7 6 7
  coeffs_h[3] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0e0cu));

  const __m256i round_const_h =
      _mm256_set1_epi16((1 << (conv_params->round_0 - 1)));
  const __m256i round_const_horz =
      _mm256_set1_epi16((1 << (bd + FILTER_BITS - conv_params->round_0 - 1)));
  const __m256i clamp_low = _mm256_setzero_si256();
  const __m256i clamp_high =
      _mm256_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1);
  const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0);

  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i zero_128 = _mm_setzero_si128();
  const __m128i offset_0 = _mm_insert_epi16(zero_128, 1 << FILTER_BITS, 3);
  const __m128i coeffs_y = _mm_add_epi16(xx_loadu_128(filter_y), offset_0);

  const __m256i filter_coeffs_y = _mm256_broadcastsi128_si256(coeffs_y);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs_v[0] = _mm256_shuffle_epi32(filter_coeffs_y, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs_v[1] = _mm256_shuffle_epi32(filter_coeffs_y, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs_v[2] = _mm256_shuffle_epi32(filter_coeffs_y, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs_v[3] = _mm256_shuffle_epi32(filter_coeffs_y, 0xff);

  const __m256i round_const_v =
      _mm256_set1_epi32((1 << (conv_params->round_1 - 1)) -
                        (1 << (bd + conv_params->round_1 - 1)));
  const __m128i round_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

  for (j = 0; j < w; j += 8) {
    for (i = 0; i < im_h; i += 2) {
      __m256i data = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)&src_ptr[(i * src_stride) + j]));

      // Load the next line
      if (i + 1 < im_h)
        data = _mm256_inserti128_si256(
            data,
            _mm_loadu_si128(
                (__m128i *)&src_ptr[(i * src_stride) + j + src_stride]),
            1);

      __m256i res = convolve_lowbd_x(data, coeffs_h, filt);

      res =
          _mm256_sra_epi16(_mm256_add_epi16(res, round_const_h), round_shift_h);

      __m256i data_0 = _mm256_shuffle_epi8(data, filt_center);

      // multiply the center pixel by 2^(FILTER_BITS - round_0) and add it to
      // the result
      data_0 = _mm256_slli_epi16(data_0, FILTER_BITS - conv_params->round_0);
      res = _mm256_add_epi16(res, data_0);
      res = _mm256_add_epi16(res, round_const_horz);
      const __m256i res_clamped =
          _mm256_min_epi16(_mm256_max_epi16(res, clamp_low), clamp_high);
      _mm256_store_si256((__m256i *)&im_block[i * im_stride], res_clamped);
    }

    /* Vertical filter */
    {
      __m256i src_0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i src_1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i src_2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i src_3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i src_4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i src_5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      __m256i s[8];
      s[0] = _mm256_unpacklo_epi16(src_0, src_1);
      s[1] = _mm256_unpacklo_epi16(src_2, src_3);
      s[2] = _mm256_unpacklo_epi16(src_4, src_5);

      s[4] = _mm256_unpackhi_epi16(src_0, src_1);
      s[5] = _mm256_unpackhi_epi16(src_2, src_3);
      s[6] = _mm256_unpackhi_epi16(src_4, src_5);

      for (i = 0; i < h - 1; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        __m256i res_a = convolve(s, coeffs_v);
        __m256i res_b = convolve(s + 4, coeffs_v);

        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_v), round_shift_v);
        const __m256i res_b_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_b, round_const_v), round_shift_v);

        /* rounding code */
        // 16 bit conversion
        const __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
        // 8 bit conversion and saturation to uint8
        const __m256i res_8b = _mm256_packus_epi16(res_16bit, res_16bit);

        const __m128i res_0 = _mm256_castsi256_si128(res_8b);
        const __m128i res_1 = _mm256_extracti128_si256(res_8b, 1);

        // Store values into the destination buffer
        __m128i *const p_0 = (__m128i *)&dst[i * dst_stride + j];
        __m128i *const p_1 = (__m128i *)&dst[i * dst_stride + j + dst_stride];

        _mm_storel_epi64(p_0, res_0);
        _mm_storel_epi64(p_1, res_1);

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
      if (h - i) {
        s[0] = _mm256_permute2x128_si256(s[0], s[4], 0x20);
        s[1] = _mm256_permute2x128_si256(s[1], s[5], 0x20);
        s[2] = _mm256_permute2x128_si256(s[2], s[6], 0x20);

        const int16_t *data = &im_block[i * im_stride];
        const __m128i s6_ = _mm_loadu_si128((__m128i *)(data + 6 * im_stride));
        const __m128i s7_ = _mm_loadu_si128((__m128i *)(data + 7 * im_stride));

        __m128i s3 = _mm_unpacklo_epi16(s6_, s7_);
        __m128i s7 = _mm_unpackhi_epi16(s6_, s7_);

        s[3] = _mm256_inserti128_si256(_mm256_castsi128_si256(s3), s7, 1);
        __m256i convolveres = convolve(s, coeffs_v);

        const __m256i res_round = _mm256_sra_epi32(
            _mm256_add_epi32(convolveres, round_const_v), round_shift_v);

        /* rounding code */
        // 16 bit conversion
        __m128i reslo = _mm256_castsi256_si128(res_round);
        __m128i reshi = _mm256_extracti128_si256(res_round, 1);
        const __m128i res_16bit = _mm_packus_epi32(reslo, reshi);

        // 8 bit conversion and saturation to uint8
        const __m128i res_8b = _mm_packus_epi16(res_16bit, res_16bit);
        __m128i *const p_0 = (__m128i *)&dst[i * dst_stride + j];
        _mm_storel_epi64(p_0, res_8b);
      }
    }
  }
}